

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

void __thiscall QRenderRule::QRenderRule(QRenderRule *this,QRenderRule *param_1)

{
  Data *pDVar1;
  QStyleSheetPaletteData *pQVar2;
  QStyleSheetBoxData *pQVar3;
  QStyleSheetBackgroundData *pQVar4;
  QStyleSheetBorderData *pQVar5;
  QStyleSheetOutlineData *pQVar6;
  QStyleSheetGeometryData *pQVar7;
  QStyleSheetPositionData *pQVar8;
  QStyleSheetImageData *pQVar9;
  
  this->features = param_1->features;
  QBrush::QBrush(&this->defaultBackground,&param_1->defaultBackground);
  QFont::QFont(&this->font,&param_1->font);
  this->hasFont = param_1->hasFont;
  pDVar1 = (param_1->styleHints).d;
  (this->styleHints).d = pDVar1;
  if ((pDVar1 != (Data *)0x0) && ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)
     ) {
    LOCK();
    (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
         (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pQVar2 = (param_1->pal).d.ptr;
  (this->pal).d.ptr = pQVar2;
  if (pQVar2 != (QStyleSheetPaletteData *)0x0) {
    LOCK();
    (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  pQVar3 = (param_1->b).d.ptr;
  (this->b).d.ptr = pQVar3;
  if (pQVar3 != (QStyleSheetBoxData *)0x0) {
    LOCK();
    (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  pQVar4 = (param_1->bg).d.ptr;
  (this->bg).d.ptr = pQVar4;
  if (pQVar4 != (QStyleSheetBackgroundData *)0x0) {
    LOCK();
    (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  pQVar5 = (param_1->bd).d.ptr;
  (this->bd).d.ptr = pQVar5;
  if (pQVar5 != (QStyleSheetBorderData *)0x0) {
    LOCK();
    (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  pQVar6 = (param_1->ou).d.ptr;
  (this->ou).d.ptr = pQVar6;
  if (pQVar6 != (QStyleSheetOutlineData *)0x0) {
    LOCK();
    (pQVar6->super_QStyleSheetBorderData).super_QSharedData.ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(pQVar6->super_QStyleSheetBorderData).super_QSharedData.ref.
                     super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  pQVar7 = (param_1->geo).d.ptr;
  (this->geo).d.ptr = pQVar7;
  if (pQVar7 != (QStyleSheetGeometryData *)0x0) {
    LOCK();
    (pQVar7->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pQVar7->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  pQVar8 = (param_1->p).d.ptr;
  (this->p).d.ptr = pQVar8;
  if (pQVar8 != (QStyleSheetPositionData *)0x0) {
    LOCK();
    (pQVar8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pQVar8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  pQVar9 = (param_1->img).d.ptr;
  (this->img).d.ptr = pQVar9;
  if (pQVar9 != (QStyleSheetImageData *)0x0) {
    LOCK();
    (pQVar9->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pQVar9->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  pQVar9 = (param_1->iconPtr).d.ptr;
  (this->iconPtr).d.ptr = pQVar9;
  if (pQVar9 != (QStyleSheetImageData *)0x0) {
    LOCK();
    (pQVar9->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pQVar9->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  this->clipset = param_1->clipset;
  QPainterPath::QPainterPath(&this->clipPath,&param_1->clipPath);
  return;
}

Assistant:

QRenderRule() : features(0), hasFont(false), pal(nullptr), b(nullptr), bg(nullptr), bd(nullptr), ou(nullptr), geo(nullptr), p(nullptr), img(nullptr), clipset(0) { }